

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

cio_error write_ping_or_pong_message
                    (cio_websocket *websocket,cio_websocket_frame_type frame_type,
                    cio_websocket_write_job *job,cio_write_buffer *payload,
                    cio_websocket_write_handler_t handler,void *handler_context)

{
  ulong uVar1;
  cio_write_buffer *pcVar2;
  cio_error cStack_10;
  
  cStack_10 = CIO_INVALID_ARGUMENT;
  if (handler != (cio_websocket_write_handler_t)0x0) {
    if (payload != (cio_write_buffer *)0x0) {
      uVar1 = 0;
      pcVar2 = payload;
      while (pcVar2 = pcVar2->next, pcVar2 != payload) {
        uVar1 = uVar1 + (pcVar2->data).element.length;
      }
      if (0x7d < uVar1) {
        return CIO_INVALID_ARGUMENT;
      }
    }
    if (job->wbh == (cio_write_buffer *)0x0) {
      job->wbh = payload;
      job->handler = handler;
      job->handler_context = handler_context;
      job->frame_type = frame_type;
      job->last_frame = true;
      job->stream_handler = message_written;
      enqueue_job(websocket,job,(payload->data).element.length);
      cStack_10 = CIO_SUCCESS;
    }
    else {
      cStack_10 = CIO_OPERATION_NOT_PERMITTED;
    }
  }
  return cStack_10;
}

Assistant:

static enum cio_error write_ping_or_pong_message(struct cio_websocket *websocket, enum cio_websocket_frame_type frame_type, struct cio_websocket_write_job *job, struct cio_write_buffer *payload, cio_websocket_write_handler_t handler, void *handler_context)
{
	if (cio_unlikely(handler == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely(payload_size_in_limit(payload, CIO_WEBSOCKET_SMALL_FRAME_SIZE) == 0)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely(job->wbh != NULL)) {
		return CIO_OPERATION_NOT_PERMITTED;
	}

	job->wbh = payload;
	job->handler = handler;
	job->handler_context = handler_context;
	job->frame_type = frame_type;
	job->last_frame = true;
	job->stream_handler = message_written;

	size_t length = cio_write_buffer_get_total_size(payload);
	enqueue_job(websocket, job, length);
	return CIO_SUCCESS;
}